

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImFontAtlas::CalcCustomRectUV
          (ImFontAtlas *this,CustomRect *rect,ImVec2 *out_uv_min,ImVec2 *out_uv_max)

{
  ulong uVar1;
  uint uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  ImVec2 IVar7;
  ImVec2 IVar8;
  
  if ((0 < this->TexWidth) && (0 < this->TexHeight)) {
    if (rect->X != 0xffff) {
      IVar8.x = (this->TexUvScale).x * (float)rect->X;
      IVar8.y = (this->TexUvScale).y * (float)rect->Y;
      *out_uv_min = IVar8;
      uVar1._0_2_ = rect->X;
      uVar1._2_2_ = rect->Y;
      uVar1._4_4_ = rect->GlyphAdvanceX;
      auVar3._8_4_ = 0;
      auVar3._0_8_ = uVar1;
      auVar3._12_2_ = (short)((uint)uVar1._4_4_ >> 0x10);
      auVar4._8_2_ = (short)uVar1._4_4_;
      auVar4._0_8_ = uVar1;
      auVar4._10_4_ = auVar3._10_4_;
      auVar6._6_8_ = 0;
      auVar6._0_6_ = auVar4._8_6_;
      auVar5._4_2_ = uVar1._2_2_;
      auVar5._0_4_ = (uint)uVar1;
      auVar5._6_8_ = SUB148(auVar6 << 0x40,6);
      uVar2._0_2_ = rect->Width;
      uVar2._2_2_ = rect->Height;
      IVar7.x = (this->TexUvScale).x * (float)((uVar2 & 0xffff) + ((uint)uVar1 & 0xffff));
      IVar7.y = (this->TexUvScale).y * (float)((uVar2 >> 0x10) + auVar5._4_4_);
      *out_uv_max = IVar7;
      return;
    }
    __assert_fail("rect->IsPacked()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                  ,0x66a,
                  "void ImFontAtlas::CalcCustomRectUV(const CustomRect *, ImVec2 *, ImVec2 *)");
  }
  __assert_fail("TexWidth > 0 && TexHeight > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                ,0x669,"void ImFontAtlas::CalcCustomRectUV(const CustomRect *, ImVec2 *, ImVec2 *)")
  ;
}

Assistant:

void ImFontAtlas::CalcCustomRectUV(const CustomRect* rect, ImVec2* out_uv_min, ImVec2* out_uv_max)
{
    IM_ASSERT(TexWidth > 0 && TexHeight > 0);   // Font atlas needs to be built before we can calculate UV coordinates
    IM_ASSERT(rect->IsPacked());                // Make sure the rectangle has been packed
    *out_uv_min = ImVec2((float)rect->X * TexUvScale.x, (float)rect->Y * TexUvScale.y);
    *out_uv_max = ImVec2((float)(rect->X + rect->Width) * TexUvScale.x, (float)(rect->Y + rect->Height) * TexUvScale.y);
}